

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O0

bool Omega_h::gmsh::anon_unknown_0::seek_optional_section(istream *stream,string *want)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  istream *piVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  bool found;
  pos_type pos;
  string line;
  string *want_local;
  istream *stream_local;
  
  bVar1 = std::ios::operator_cast_to_bool(stream + *(long *)(*(long *)stream + -0x18));
  if (!bVar1) {
    fail("assertion %s failed at %s +%d\n","stream",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0x6e);
  }
  std::__cxx11::string::string((string *)&pos._M_state);
  auVar8 = std::istream::tellg();
  pos._M_off = auVar8._8_8_;
  bVar1 = false;
  do {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)&pos._M_state);
    bVar2 = std::ios::operator_cast_to_bool(piVar4 + *(long *)(*(long *)piVar4 + -0x18));
    if (!bVar2) break;
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &pos._M_state,want);
    if (_Var3) {
      bVar1 = true;
      break;
    }
    uVar5 = std::__cxx11::string::empty();
  } while ((((uVar5 & 1) != 0) ||
           (lVar6 = std::__cxx11::string::rfind((char *)&pos._M_state,0x731bfa), lVar6 == 0)) ||
          (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&pos._M_state), *pcVar7 != '$'))
  ;
  if (bVar1 == false) {
    std::ios::clear(stream + *(long *)(*(long *)stream + -0x18),0);
    std::istream::seekg(stream,auVar8._0_8_,pos._M_off);
  }
  bVar2 = std::ios::operator_cast_to_bool(stream + *(long *)(*(long *)stream + -0x18));
  if (bVar2) {
    std::__cxx11::string::~string((string *)&pos._M_state);
    return bVar1;
  }
  fail("assertion %s failed at %s +%d\n","stream",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
       ,0x80);
}

Assistant:

static bool seek_optional_section(
    std::istream& stream, std::string const& want) {
  OMEGA_H_CHECK(stream);
  std::string line;
  auto const pos = stream.tellg();
  bool found = false;
  while (std::getline(stream, line)) {
    if (line == want) {
      found = true;
      break;
    }
    if (!line.empty() && line.rfind("$End") != 0 && line[0] == '$') {
      // found the beginning of a new section that is not the one expected
      break;
    }
  }
  if (!found) {
    stream.clear();
    stream.seekg(pos);
  }
  OMEGA_H_CHECK(stream);
  return found;
}